

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O1

void __thiscall TasGrid::GridGlobal::write<true>(GridGlobal *this,ostream *os)

{
  pointer piVar1;
  undefined1 uVar2;
  undefined8 in_RAX;
  char cflag;
  char cflag_1;
  char cflag_2;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  IO::writeNumbers<true,(TasGrid::IO::IOPad)1,int,int>
            (os,(this->super_BaseCanonicalGrid).num_dimensions,
             (this->super_BaseCanonicalGrid).num_outputs);
  IO::writeNumbers<true,(TasGrid::IO::IOPad)3,double,double>(os,this->alpha,this->beta);
  IO::writeRule<true>(this->rule,os);
  if (this->rule == rule_customtabulated) {
    CustomTabulated::write<true>(&this->custom,os);
  }
  MultiIndexSet::write<true>(&this->tensors,os);
  MultiIndexSet::write<true>(&this->active_tensors,os);
  piVar1 = (this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    ::std::ostream::write((char *)os,(long)piVar1);
  }
  uVar2 = 0x79;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar2 = 0x6e;
  }
  uStack_28._0_6_ = CONCAT15(uVar2,(undefined5)uStack_28);
  ::std::ostream::write((char *)os,(long)&uStack_28 + 5);
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    MultiIndexSet::write<true>(&(this->super_BaseCanonicalGrid).points,os);
  }
  uVar2 = 0x79;
  if ((this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar2 = 0x6e;
  }
  uStack_28._0_7_ = CONCAT16(uVar2,(undefined6)uStack_28);
  ::std::ostream::write((char *)os,(long)&uStack_28 + 6);
  if ((this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    MultiIndexSet::write<true>(&(this->super_BaseCanonicalGrid).needed,os);
  }
  ::std::ostream::write
            ((char *)os,
             (long)(this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start);
  if (0 < (this->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::write<true>(&(this->super_BaseCanonicalGrid).values,os);
  }
  uVar2 = 0x79;
  if ((this->updated_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->updated_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar2 = 0x6e;
  }
  uStack_28 = CONCAT17(uVar2,(undefined7)uStack_28);
  ::std::ostream::write((char *)os,(long)&uStack_28 + 7);
  if ((this->updated_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->updated_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    MultiIndexSet::write<true>(&this->updated_tensors,os);
    MultiIndexSet::write<true>(&this->updated_active_tensors,os);
    ::std::ostream::write
              ((char *)os,
               (long)(this->updated_active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridGlobal::write(std::ostream &os) const{
    if (iomode == mode_ascii){ os << std::scientific; os.precision(17); }
    IO::writeNumbers<iomode, IO::pad_rspace>(os, num_dimensions, num_outputs);
    IO::writeNumbers<iomode, IO::pad_line>(os, alpha, beta);
    IO::writeRule<iomode>(rule, os);
    if (rule == rule_customtabulated)
        custom.write<iomode>(os);

    tensors.write<iomode>(os);
    active_tensors.write<iomode>(os);
    if (!active_w.empty())
        IO::writeVector<iomode, IO::pad_line>(active_w, os);

    IO::writeFlag<iomode, IO::pad_auto>(!points.empty(), os);
    if (!points.empty()) points.write<iomode>(os);
    IO::writeFlag<iomode, IO::pad_auto>(!needed.empty(), os);
    if (!needed.empty()) needed.write<iomode>(os);

    IO::writeVector<iomode, IO::pad_line>(max_levels, os);

    if (num_outputs > 0) values.write<iomode>(os);

    IO::writeFlag<iomode, IO::pad_line>(!updated_tensors.empty(), os);
    if (!updated_tensors.empty()){
        updated_tensors.write<iomode>(os);
        updated_active_tensors.write<iomode>(os);
        IO::writeVector<iomode, IO::pad_line>(updated_active_w, os);
    }
}